

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form2_Normalize(NormalizeForm2 Normalize)

{
  uchar uVar1;
  uint8_t value;
  bool bVar2;
  allocator_type local_91;
  vector<unsigned_char,_std::allocator<unsigned_char>_> normalized;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image output;
  
  Unit_Test::intensityArray(&intensity,2);
  Unit_Test::randomImage(&input,&intensity);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (&output,input._width,input._height,'\x01','\x01');
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::fill(&output,value);
  (*Normalize)(&input,&output);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&normalized,2,&local_91);
  uVar1 = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((uVar1 == intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[1]) ||
     ((input._width == 1 && (input._height == 1)))) {
    normalized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = uVar1;
    *normalized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = uVar1;
  }
  else {
    *normalized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = '\0';
    normalized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = 0xff;
  }
  bVar2 = Unit_Test::verifyImage(&output,&normalized,true);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&normalized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar2;
}

Assistant:

bool form2_Normalize(NormalizeForm2 Normalize)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const PenguinV_Image::Image input  = randomImage( intensity );
        PenguinV_Image::Image output( input.width(), input.height() );

        output.fill( intensityValue() );

        Normalize( input, output );

        std::vector < uint8_t > normalized( 2 );

        if( intensity[0] == intensity[1] || (input.width() == 1 && input.height() == 1) ) {
            normalized[0] = normalized[1] = intensity[0];
        }
        else {
            normalized[0] = 0;
            normalized[1] = 255;
        }

        return verifyImage( output, normalized );
    }